

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_loop_shape.cc
# Opt level: O1

void __thiscall
S2LaxLoopShape::Init
          (S2LaxLoopShape *this,vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices
          )

{
  Vector3<double> *pVVar1;
  pointer __src;
  undefined1 auVar2 [16];
  ulong uVar3;
  Vector3<double> *__s;
  int iVar4;
  size_t __n;
  ulong uVar5;
  
  uVar3 = ((long)(vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                _M_impl.super__Vector_impl_data._M_start) / 0x18;
  iVar4 = (int)uVar3;
  *(int *)&(this->super_S2Shape).field_0xc = iVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar4;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
    uVar5 = SUB168(auVar2 * ZEXT816(0x18),0);
  }
  __s = (Vector3<double> *)operator_new__(uVar5);
  if ((uVar3 & 0xffffffff) != 0) {
    memset(__s,0,(((long)iVar4 * 0x18 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  pVVar1 = (this->vertices_)._M_t.
           super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
           super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
           super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl;
  (this->vertices_)._M_t.
  super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
  super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl = __s;
  if (pVVar1 != (Vector3<double> *)0x0) {
    operator_delete__(pVVar1);
  }
  __src = (vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl
          .super__Vector_impl_data._M_start;
  __n = (long)(vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish - (long)__src;
  if (__n != 0) {
    memmove((this->vertices_)._M_t.
            super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
            super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
            super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl,__src,__n);
    return;
  }
  return;
}

Assistant:

void S2LaxLoopShape::Init(const vector<S2Point>& vertices) {
  num_vertices_ = vertices.size();
  vertices_.reset(new S2Point[num_vertices_]);
  std::copy(vertices.begin(), vertices.end(), vertices_.get());
}